

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall DPolyobjInterpolation::Interpolate(DPolyobjInterpolation *this,double smoothratio)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  FPolyObj *this_00;
  vertex_t **ppvVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  byte bVar8;
  double dVar9;
  double dVar10;
  ulong uVar11;
  ulong uVar12;
  
  this_00 = this->poly;
  uVar11 = (ulong)(this_00->Vertices).Count;
  if (uVar11 == 0) {
    bVar8 = 0;
  }
  else {
    ppvVar4 = (this_00->Vertices).Array;
    pdVar5 = (this->oldverts).Array;
    pdVar6 = (this->bakverts).Array;
    uVar12 = 0;
    bVar8 = 0;
    do {
      pdVar7 = *(double **)((long)ppvVar4 + uVar12 * 4);
      dVar2 = *pdVar7;
      pdVar6[uVar12 & 0xffffffff] = dVar2;
      dVar3 = pdVar7[1];
      pdVar6[(int)uVar12 + 1] = dVar3;
      pdVar1 = pdVar5 + (uVar12 & 0xffffffff);
      dVar9 = *pdVar1;
      dVar10 = pdVar1[1];
      if ((dVar2 != dVar9) || (NAN(dVar2) || NAN(dVar9))) {
LAB_006b7f34:
        *pdVar7 = (dVar2 - dVar9) * smoothratio + dVar9;
        pdVar7[1] = (dVar3 - dVar10) * smoothratio + dVar10;
        bVar8 = 1;
      }
      else if ((dVar3 != dVar10) || (NAN(dVar3) || NAN(dVar10))) goto LAB_006b7f34;
      uVar12 = uVar12 + 2;
    } while (uVar11 * 2 != uVar12);
  }
  if (!(bool)((this->super_DInterpolation).refcount != 0 | bVar8)) {
    (*(this->super_DInterpolation).super_DObject._vptr_DObject[4])(this);
    return;
  }
  dVar2 = (this_00->CenterSpot).pos.X;
  dVar3 = (this_00->CenterSpot).pos.Y;
  this->bakcx = dVar2;
  this->bakcy = dVar3;
  dVar9 = this->oldcy;
  (this_00->CenterSpot).pos.X = smoothratio * (dVar2 - this->oldcx) + dVar2;
  (this_00->CenterSpot).pos.Y = smoothratio * (dVar3 - dVar9) + dVar3;
  FPolyObj::ClearSubsectorLinks(this_00);
  return;
}

Assistant:

void DPolyobjInterpolation::Interpolate(double smoothratio)
{
	bool changed = false;
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		bakverts[i*2  ] = poly->Vertices[i]->fX();
		bakverts[i*2+1] = poly->Vertices[i]->fY();

		if (bakverts[i * 2] != oldverts[i * 2] || bakverts[i * 2 + 1] != oldverts[i * 2 + 1])
		{
			changed = true;
			poly->Vertices[i]->set(
				oldverts[i * 2] + (bakverts[i * 2] - oldverts[i * 2]) * smoothratio,
				oldverts[i * 2 + 1] + (bakverts[i * 2 + 1] - oldverts[i * 2 + 1]) * smoothratio);
		}
	}
	if (refcount == 0 && !changed)
	{
		Destroy();
	}
	else
	{
		bakcx = poly->CenterSpot.pos.X;
		bakcy = poly->CenterSpot.pos.Y;
		poly->CenterSpot.pos.X = bakcx + (bakcx - oldcx) * smoothratio;
		poly->CenterSpot.pos.Y = bakcy + (bakcy - oldcy) * smoothratio;

		poly->ClearSubsectorLinks();
	}
}